

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall
wabt::WastParser::ParsePlainInstr
          (WastParser *this,unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  Location loc_00;
  Location loc_01;
  Location loc_02;
  Location loc_03;
  Location loc_04;
  Location loc_05;
  Location loc_06;
  Location loc_07;
  Location loc_08;
  Location loc_09;
  Location loc_10;
  Location loc_11;
  Location loc_12;
  Location loc_13;
  Location loc_14;
  Location loc_15;
  Location loc_16;
  Location loc_17;
  Location loc_18;
  Location loc_19;
  Location loc_20;
  Location loc_21;
  size_type sVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  bool bVar10;
  TokenType TVar11;
  Result RVar12;
  Enum EVar13;
  Expr *pEVar14;
  Expr *pEVar15;
  undefined *puVar16;
  ExprType *this_00;
  Token *pTVar17;
  undefined1 auVar18 [8];
  Token local_9c8;
  Token local_978;
  Token local_928;
  Token local_8d8;
  Token local_888;
  Token local_838;
  Token local_7e8;
  Token local_798;
  Token local_748;
  Token local_6f8;
  Token local_6a8;
  Token local_658;
  Token local_608;
  Token local_5b8;
  Token local_568;
  Token local_518;
  Token local_4c8;
  undefined8 local_478;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  undefined8 uStack_464;
  Token local_458;
  Token local_408;
  Token local_3b8;
  Token local_368;
  Token local_318;
  Token local_2c8;
  Token local_278;
  Token local_228;
  _func_int **pp_Stack_1d8;
  uint64_t lane_idx;
  undefined4 uStack_1c8;
  undefined8 uStack_1c4;
  undefined4 local_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined8 local_198;
  size_type sStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  size_type sStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  size_type sStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  size_type sStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  size_type sStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  size_type sStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  size_type sStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  size_type sStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 auStack_98 [8];
  Token token;
  Location loc;
  
  GetToken((Token *)auStack_98,this);
  uVar9 = token.loc.field_1.field_0.first_column;
  uVar8 = token.loc.field_1.field_0.line;
  iVar7 = token.loc.filename.size_._4_4_;
  iVar6 = (int)token.loc.filename.size_;
  uVar5 = token.loc.filename.data_._4_4_;
  uVar4 = token.loc.filename.data_._0_4_;
  sVar1 = CONCAT44(token.loc.filename.data_._4_4_,token.loc.filename.data_._0_4_);
  uVar2 = CONCAT44(token.loc.filename.size_._4_4_,(int)token.loc.filename.size_);
  uVar3 = CONCAT44(token.loc.field_1.field_0.first_column,token.loc.field_1.field_0.line);
  token.field_2._32_8_ = auStack_98;
  Token::~Token((Token *)auStack_98);
  TVar11 = Peek(this,0);
  switch(TVar11) {
  case AtomicLoad:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    local_118 = token.field_2._32_8_;
    sStack_110 = sVar1;
    local_108 = uVar2;
    uStack_100 = uVar3;
    Token::Token(&local_318,(Token *)auStack_98);
    loc_00.filename.size_ = sStack_110;
    loc_00.filename.data_ = (char *)local_118;
    loc_00.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_108;
    loc_00.field_1._8_8_ = uStack_100;
    RVar12 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)0>>
                       (this,loc_00,&local_318,out_expr);
    pTVar17 = &local_318;
    goto LAB_00f73a31;
  case AtomicRmw:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    local_d8 = token.field_2._32_8_;
    sStack_d0 = sVar1;
    local_c8 = uVar2;
    uStack_c0 = uVar3;
    Token::Token(&local_278,(Token *)auStack_98);
    loc_12.filename.size_ = sStack_d0;
    loc_12.filename.data_ = (char *)local_d8;
    loc_12.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_c8;
    loc_12.field_1._8_8_ = uStack_c0;
    RVar12 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)1>>
                       (this,loc_12,&local_278,out_expr);
    pTVar17 = &local_278;
    goto LAB_00f73a31;
  case AtomicRmwCmpxchg:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    local_b8 = token.field_2._32_8_;
    sStack_b0 = sVar1;
    local_a8 = uVar2;
    uStack_a0 = uVar3;
    Token::Token(&local_228,(Token *)auStack_98);
    loc_16.filename.size_ = sStack_b0;
    loc_16.filename.data_ = (char *)local_b8;
    loc_16.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_a8;
    loc_16.field_1._8_8_ = uStack_a0;
    RVar12 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)2>>
                       (this,loc_16,&local_228,out_expr);
    pTVar17 = &local_228;
    goto LAB_00f73a31;
  case AtomicStore:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    local_f8 = token.field_2._32_8_;
    sStack_f0 = sVar1;
    local_e8 = uVar2;
    uStack_e0 = uVar3;
    Token::Token(&local_2c8,(Token *)auStack_98);
    loc_10.filename.size_ = sStack_f0;
    loc_10.filename.data_ = (char *)local_f8;
    loc_10.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_e8;
    loc_10.field_1._8_8_ = uStack_e0;
    RVar12 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)3>>
                       (this,loc_10,&local_2c8,out_expr);
    pTVar17 = &local_2c8;
    goto LAB_00f73a31;
  case AtomicWait:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    local_138 = token.field_2._32_8_;
    sStack_130 = sVar1;
    local_128 = uVar2;
    uStack_120 = uVar3;
    Token::Token(&local_368,(Token *)auStack_98);
    loc_15.filename.size_ = sStack_130;
    loc_15.filename.data_ = (char *)local_138;
    loc_15.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_128;
    loc_15.field_1._8_8_ = uStack_120;
    RVar12 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)4>>
                       (this,loc_15,&local_368,out_expr);
    pTVar17 = &local_368;
    goto LAB_00f73a31;
  case AtomicWake:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    local_158 = token.field_2._32_8_;
    sStack_150 = sVar1;
    local_148 = uVar2;
    uStack_140 = uVar3;
    Token::Token(&local_3b8,(Token *)auStack_98);
    loc_18.filename.size_ = sStack_150;
    loc_18.filename.data_ = (char *)local_158;
    loc_18.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_148;
    loc_18.field_1._8_8_ = uStack_140;
    RVar12 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)5>>
                       (this,loc_18,&local_3b8,out_expr);
    pTVar17 = &local_3b8;
LAB_00f73a31:
    Token::~Token(pTVar17);
    pTVar17 = (Token *)auStack_98;
LAB_00f73a3d:
    Token::~Token(pTVar17);
joined_r0x00f73f03:
    if (RVar12.enum_ == Error) {
      return (Result)Error;
    }
    goto LAB_00f73e3e;
  case Binary:
    pEVar15 = (Expr *)operator_new(0x40);
    Consume((Token *)auStack_98,this);
    if (0x33 < token.loc.field_1.field_0.last_column - 0x29U) {
LAB_00f73f0e:
      __assert_fail("HasOpcode()",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/token.h"
                    ,0x6b,"Opcode wabt::Token::opcode() const");
    }
    (pEVar15->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar15->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar15->_vptr_Expr = (_func_int **)&PTR__Expr_0155b510;
    *(undefined4 *)&(pEVar15->loc).filename.data_ = token.field_2._32_4_;
    *(undefined4 *)((long)&(pEVar15->loc).filename.data_ + 4) = token.field_2._36_4_;
    *(undefined4 *)&(pEVar15->loc).filename.size_ = uVar4;
    *(undefined4 *)((long)&(pEVar15->loc).filename.size_ + 4) = uVar5;
    (pEVar15->loc).field_1.field_0.line = iVar6;
    (pEVar15->loc).field_1.field_0.first_column = iVar7;
    (pEVar15->loc).field_1.field_0.last_column = uVar8;
    *(undefined4 *)((long)&(pEVar15->loc).field_1 + 0xc) = uVar9;
    pEVar15->type_ = Binary;
    puVar16 = &OpcodeExpr<(wabt::ExprType)6>::vtable;
    goto LAB_00f733cb;
  default:
    __assert_fail("!\"ParsePlainInstr should only be called when IsPlainInstr() is true\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/wast-parser.cc"
                  ,0x648,"Result wabt::WastParser::ParsePlainInstr(std::unique_ptr<Expr> *)");
  case Br:
    Consume(&local_888,this);
    Token::~Token(&local_888);
    loc_17.filename.size_ = sVar1;
    loc_17.filename.data_ = (char *)token.field_2._32_8_;
    loc_17.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)uVar2;
    loc_17.field_1._8_8_ = uVar3;
    RVar12 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)8>>(this,loc_17,out_expr);
    break;
  case BrIf:
    Consume(&local_838,this);
    Token::~Token(&local_838);
    loc_08.filename.size_ = sVar1;
    loc_08.filename.data_ = (char *)token.field_2._32_8_;
    loc_08.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)uVar2;
    loc_08.field_1._8_8_ = uVar3;
    RVar12 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)9>>(this,loc_08,out_expr);
    break;
  case BrTable:
    Consume(&local_7e8,this);
    Token::~Token(&local_7e8);
    MakeUnique<wabt::BrTableExpr,wabt::Location&>
              ((wabt *)auStack_98,(Location *)((long)&token.field_2.literal_.text.field_2 + 8));
    bVar10 = ParseVarListOpt(this,(VarVector *)((long)auStack_98 + 0x40));
    if (bVar10) {
      Var::operator=((Var *)&((Expr *)((long)auStack_98 + 0x40))->loc,
                     (Var *)&(((Expr *)((long)auStack_98 + 0x40))->
                             super_intrusive_list_base<wabt::Expr>).next_[-2].type_);
      this_00 = &(((Expr *)((long)auStack_98 + 0x40))->super_intrusive_list_base<wabt::Expr>).next_
                 [-2].type_;
      (((Expr *)((long)auStack_98 + 0x40))->super_intrusive_list_base<wabt::Expr>).next_ =
           (Expr *)this_00;
      Var::~Var((Var *)this_00);
      auVar18 = auStack_98;
      auStack_98 = (undefined1  [8])0x0;
      pEVar15 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>
                ._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
      (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)auVar18;
      if (pEVar15 != (Expr *)0x0) {
        (*pEVar15->_vptr_Expr[1])();
      }
    }
    if (auStack_98 != (undefined1  [8])0x0) {
      (*(*(_func_int ***)auStack_98)[1])();
    }
    if (!bVar10) {
      return (Result)Error;
    }
    goto LAB_00f73e3e;
  case Call:
    Consume(&local_748,this);
    Token::~Token(&local_748);
    loc_07.filename.size_ = sVar1;
    loc_07.filename.data_ = (char *)token.field_2._32_8_;
    loc_07.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)uVar2;
    loc_07.field_1._8_8_ = uVar3;
    RVar12 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)11>>(this,loc_07,out_expr);
    break;
  case CallIndirect:
    Consume(&local_6f8,this);
    Token::~Token(&local_6f8);
    MakeUnique<wabt::CallIndirectExpr,wabt::Location&>
              ((wabt *)auStack_98,(Location *)((long)&token.field_2.literal_.text.field_2 + 8));
    RVar12 = ParseTypeUseOpt(this,(FuncDeclaration *)((long)auStack_98 + 0x40));
    if (RVar12.enum_ == Error) goto LAB_00f73b74;
    RVar12 = ParseUnboundFuncSignature
                       (this,(FuncSignature *)
                             &(((Expr *)((long)auStack_98 + 0x80))->
                              super_intrusive_list_base<wabt::Expr>).prev_);
    goto LAB_00f73b6b;
  case Compare:
    pEVar15 = (Expr *)operator_new(0x40);
    Consume((Token *)auStack_98,this);
    if (0x33 < token.loc.field_1.field_0.last_column - 0x29U) goto LAB_00f73f0e;
    (pEVar15->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar15->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar15->_vptr_Expr = (_func_int **)&PTR__Expr_0155b510;
    *(undefined4 *)&(pEVar15->loc).filename.data_ = token.field_2._32_4_;
    *(undefined4 *)((long)&(pEVar15->loc).filename.data_ + 4) = token.field_2._36_4_;
    *(undefined4 *)&(pEVar15->loc).filename.size_ = uVar4;
    *(undefined4 *)((long)&(pEVar15->loc).filename.size_ + 4) = uVar5;
    (pEVar15->loc).field_1.field_0.line = iVar6;
    (pEVar15->loc).field_1.field_0.first_column = iVar7;
    (pEVar15->loc).field_1.field_0.last_column = uVar8;
    *(undefined4 *)((long)&(pEVar15->loc).field_1 + 0xc) = uVar9;
    pEVar15->type_ = Compare;
    puVar16 = &OpcodeExpr<(wabt::ExprType)13>::vtable;
LAB_00f733cb:
    pEVar15->_vptr_Expr = (_func_int **)(puVar16 + 0x10);
    *(TokenType *)&pEVar15->field_0x3c = token.token_type_;
    pEVar14 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
              _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
              super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = pEVar15;
    goto LAB_00f73ddb;
  case Const:
    uStack_1c8 = 0;
    uStack_1c4 = 0;
    pp_Stack_1d8 = (_func_int **)0x0;
    lane_idx._0_4_ = 0;
    lane_idx._4_4_ = 0;
    Const::Const((Const *)auStack_98,0);
    RVar12 = ParseConst(this,(Const *)auStack_98);
    if (RVar12.enum_ == Error) {
      return (Result)Error;
    }
    pEVar14 = (Expr *)operator_new(0x78);
    (pEVar14->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar14->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar14->_vptr_Expr = (_func_int **)&PTR__Expr_0155b510;
    (pEVar14->loc).filename.data_ = (char *)token.field_2._32_8_;
    (pEVar14->loc).filename.size_ = sVar1;
    *(undefined8 *)&(pEVar14->loc).field_1 = uVar2;
    *(undefined8 *)((long)&(pEVar14->loc).field_1 + 8) = uVar3;
    pEVar14->type_ = Const;
    pEVar14->_vptr_Expr = (_func_int **)&PTR__Expr_0155b9c8;
    ((_Alloc_hider *)((long)&pEVar14[1].loc.field_1 + 8))->_M_p =
         (pointer)token.field_2.text_._M_dataplus._M_p;
    *(int *)&pEVar14[1].loc.filename.size_ = token.loc.field_1.field_0.last_column;
    *(undefined4 *)((long)&pEVar14[1].loc.filename.size_ + 4) = token.loc.field_1._12_4_;
    pEVar14[1].loc.field_1.field_0.line = token.token_type_;
    pEVar14[1].loc.field_1.field_0.first_column = token._36_4_;
    *(int *)&pEVar14[1].super_intrusive_list_base<wabt::Expr>.prev_ = (int)token.loc.filename.size_;
    *(int *)((long)&pEVar14[1].super_intrusive_list_base<wabt::Expr>.prev_ + 4) =
         token.loc.filename.size_._4_4_;
    *(int *)&pEVar14[1].loc.filename.data_ = token.loc.field_1.field_0.line;
    *(int *)((long)&pEVar14[1].loc.filename.data_ + 4) = token.loc.field_1.field_0.first_column;
    *(undefined4 *)&pEVar14[1]._vptr_Expr = auStack_98._0_4_;
    *(undefined4 *)((long)&pEVar14[1]._vptr_Expr + 4) = auStack_98._4_4_;
    *(undefined4 *)&pEVar14[1].super_intrusive_list_base<wabt::Expr>.next_ =
         token.loc.filename.data_._0_4_;
    *(undefined4 *)((long)&pEVar14[1].super_intrusive_list_base<wabt::Expr>.next_ + 4) =
         token.loc.filename.data_._4_4_;
    pEVar15 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
              _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
              super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = pEVar14;
    if (pEVar15 != (Expr *)0x0) {
      (*pEVar15->_vptr_Expr[1])();
    }
    goto joined_r0x00f73f03;
  case Convert:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    pEVar15 = (Expr *)operator_new(0x40);
    if (0x33 < token.loc.field_1.field_0.last_column - 0x29U) goto LAB_00f73f0e;
    (pEVar15->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar15->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar15->_vptr_Expr = (_func_int **)&PTR__Expr_0155b510;
    *(undefined4 *)&(pEVar15->loc).filename.data_ = token.field_2._32_4_;
    *(undefined4 *)((long)&(pEVar15->loc).filename.data_ + 4) = token.field_2._36_4_;
    *(undefined4 *)&(pEVar15->loc).filename.size_ = uVar4;
    *(undefined4 *)((long)&(pEVar15->loc).filename.size_ + 4) = uVar5;
    (pEVar15->loc).field_1.field_0.line = iVar6;
    (pEVar15->loc).field_1.field_0.first_column = iVar7;
    (pEVar15->loc).field_1.field_0.last_column = uVar8;
    *(undefined4 *)((long)&(pEVar15->loc).field_1 + 0xc) = uVar9;
    pEVar15->type_ = Convert;
    puVar16 = &OpcodeExpr<(wabt::ExprType)15>::vtable;
    goto LAB_00f73dcb;
  case Drop:
    Consume(&local_928,this);
    Token::~Token(&local_928);
    pEVar15 = (Expr *)operator_new(0x40);
    (pEVar15->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar15->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar15->_vptr_Expr = (_func_int **)&PTR__Expr_0155b510;
    (pEVar15->loc).filename.data_ = (char *)token.field_2._32_8_;
    (pEVar15->loc).filename.size_ = sVar1;
    *(undefined8 *)&(pEVar15->loc).field_1 = uVar2;
    *(undefined8 *)((long)&(pEVar15->loc).field_1 + 8) = uVar3;
    pEVar15->type_ = Drop;
    puVar16 = &ExprMixin<(wabt::ExprType)16>::vtable;
    goto LAB_00f73d45;
  case GetGlobal:
    Consume(&local_5b8,this);
    Token::~Token(&local_5b8);
    loc_11.filename.size_ = sVar1;
    loc_11.filename.data_ = (char *)token.field_2._32_8_;
    loc_11.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)uVar2;
    loc_11.field_1._8_8_ = uVar3;
    RVar12 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)17>>(this,loc_11,out_expr);
    break;
  case GetLocal:
    Consume(&local_6a8,this);
    Token::~Token(&local_6a8);
    loc_09.filename.size_ = sVar1;
    loc_09.filename.data_ = (char *)token.field_2._32_8_;
    loc_09.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)uVar2;
    loc_09.field_1._8_8_ = uVar3;
    RVar12 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)18>>(this,loc_09,out_expr);
    break;
  case Load:
    local_198 = token.field_2._32_8_;
    sStack_190 = sVar1;
    local_188 = uVar2;
    uStack_180 = uVar3;
    Consume(&local_458,this);
    loc_19.filename.size_ = sStack_190;
    loc_19.filename.data_ = (char *)local_198;
    loc_19.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_188;
    loc_19.field_1._8_8_ = uStack_180;
    RVar12 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)21>>
                       (this,loc_19,&local_458,out_expr);
    pTVar17 = &local_458;
    goto LAB_00f73a3d;
  case MemoryCopy:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    Token::~Token((Token *)auStack_98);
    pEVar15 = (Expr *)operator_new(0x40);
    (pEVar15->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar15->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar15->_vptr_Expr = (_func_int **)&PTR__Expr_0155b510;
    (pEVar15->loc).filename.data_ = (char *)token.field_2._32_8_;
    (pEVar15->loc).filename.size_ = sVar1;
    *(undefined8 *)&(pEVar15->loc).field_1 = uVar2;
    *(undefined8 *)((long)&(pEVar15->loc).field_1 + 8) = uVar3;
    pEVar15->type_ = MemoryCopy;
    puVar16 = &ExprMixin<(wabt::ExprType)23>::vtable;
    goto LAB_00f73d45;
  case MemoryDrop:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    Token::~Token((Token *)auStack_98);
    loc_06.filename.size_ = sVar1;
    loc_06.filename.data_ = (char *)token.field_2._32_8_;
    loc_06.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)uVar2;
    loc_06.field_1._8_8_ = uVar3;
    RVar12 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)24>>(this,loc_06,out_expr);
    break;
  case MemoryFill:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    Token::~Token((Token *)auStack_98);
    pEVar15 = (Expr *)operator_new(0x40);
    (pEVar15->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar15->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar15->_vptr_Expr = (_func_int **)&PTR__Expr_0155b510;
    (pEVar15->loc).filename.data_ = (char *)token.field_2._32_8_;
    (pEVar15->loc).filename.size_ = sVar1;
    *(undefined8 *)&(pEVar15->loc).field_1 = uVar2;
    *(undefined8 *)((long)&(pEVar15->loc).field_1 + 8) = uVar3;
    pEVar15->type_ = MemoryFill;
    puVar16 = &ExprMixin<(wabt::ExprType)25>::vtable;
    goto LAB_00f73d45;
  case MemoryGrow:
    Consume(&local_4c8,this);
    Token::~Token(&local_4c8);
    pEVar15 = (Expr *)operator_new(0x40);
    (pEVar15->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar15->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar15->_vptr_Expr = (_func_int **)&PTR__Expr_0155b510;
    (pEVar15->loc).filename.data_ = (char *)token.field_2._32_8_;
    (pEVar15->loc).filename.size_ = sVar1;
    *(undefined8 *)&(pEVar15->loc).field_1 = uVar2;
    *(undefined8 *)((long)&(pEVar15->loc).field_1 + 8) = uVar3;
    pEVar15->type_ = MemoryGrow;
    puVar16 = &ExprMixin<(wabt::ExprType)26>::vtable;
    goto LAB_00f73d45;
  case MemoryInit:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    Token::~Token((Token *)auStack_98);
    loc_03.filename.size_ = sVar1;
    loc_03.filename.data_ = (char *)token.field_2._32_8_;
    loc_03.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)uVar2;
    loc_03.field_1._8_8_ = uVar3;
    RVar12 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)27>>(this,loc_03,out_expr);
    break;
  case MemorySize:
    Consume(&local_518,this);
    Token::~Token(&local_518);
    pEVar15 = (Expr *)operator_new(0x40);
    (pEVar15->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar15->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar15->_vptr_Expr = (_func_int **)&PTR__Expr_0155b510;
    (pEVar15->loc).filename.data_ = (char *)token.field_2._32_8_;
    (pEVar15->loc).filename.size_ = sVar1;
    *(undefined8 *)&(pEVar15->loc).field_1 = uVar2;
    *(undefined8 *)((long)&(pEVar15->loc).field_1 + 8) = uVar3;
    pEVar15->type_ = MemorySize;
    puVar16 = &ExprMixin<(wabt::ExprType)28>::vtable;
    goto LAB_00f73d45;
  case TableCopy:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    Token::~Token((Token *)auStack_98);
    pEVar15 = (Expr *)operator_new(0x40);
    (pEVar15->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar15->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar15->_vptr_Expr = (_func_int **)&PTR__Expr_0155b510;
    (pEVar15->loc).filename.data_ = (char *)token.field_2._32_8_;
    (pEVar15->loc).filename.size_ = sVar1;
    *(undefined8 *)&(pEVar15->loc).field_1 = uVar2;
    *(undefined8 *)((long)&(pEVar15->loc).field_1 + 8) = uVar3;
    pEVar15->type_ = TableCopy;
    puVar16 = &ExprMixin<(wabt::ExprType)41>::vtable;
    goto LAB_00f73d45;
  case TableDrop:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    Token::~Token((Token *)auStack_98);
    loc_13.filename.size_ = sVar1;
    loc_13.filename.data_ = (char *)token.field_2._32_8_;
    loc_13.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)uVar2;
    loc_13.field_1._8_8_ = uVar3;
    RVar12 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)42>>(this,loc_13,out_expr);
    break;
  case TableInit:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    Token::~Token((Token *)auStack_98);
    loc_20.filename.size_ = sVar1;
    loc_20.filename.data_ = (char *)token.field_2._32_8_;
    loc_20.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)uVar2;
    loc_20.field_1._8_8_ = uVar3;
    RVar12 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)40>>(this,loc_20,out_expr);
    break;
  case Nop:
    Consume(&local_978,this);
    Token::~Token(&local_978);
    pEVar15 = (Expr *)operator_new(0x40);
    (pEVar15->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar15->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar15->_vptr_Expr = (_func_int **)&PTR__Expr_0155b510;
    (pEVar15->loc).filename.data_ = (char *)token.field_2._32_8_;
    (pEVar15->loc).filename.size_ = sVar1;
    *(undefined8 *)&(pEVar15->loc).field_1 = uVar2;
    *(undefined8 *)((long)&(pEVar15->loc).field_1 + 8) = uVar3;
    pEVar15->type_ = Nop;
    puVar16 = &ExprMixin<(wabt::ExprType)29>::vtable;
    goto LAB_00f73d45;
  case Rethrow:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    Token::~Token((Token *)auStack_98);
    pEVar15 = (Expr *)operator_new(0x40);
    (pEVar15->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar15->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar15->_vptr_Expr = (_func_int **)&PTR__Expr_0155b510;
    (pEVar15->loc).filename.data_ = (char *)token.field_2._32_8_;
    (pEVar15->loc).filename.size_ = sVar1;
    *(undefined8 *)&(pEVar15->loc).field_1 = uVar2;
    *(undefined8 *)((long)&(pEVar15->loc).field_1 + 8) = uVar3;
    pEVar15->type_ = Rethrow;
    puVar16 = &ExprMixin<(wabt::ExprType)30>::vtable;
    goto LAB_00f73d45;
  case Return:
    Consume(&local_798,this);
    Token::~Token(&local_798);
    pEVar15 = (Expr *)operator_new(0x40);
    (pEVar15->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar15->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar15->_vptr_Expr = (_func_int **)&PTR__Expr_0155b510;
    (pEVar15->loc).filename.data_ = (char *)token.field_2._32_8_;
    (pEVar15->loc).filename.size_ = sVar1;
    *(undefined8 *)&(pEVar15->loc).field_1 = uVar2;
    *(undefined8 *)((long)&(pEVar15->loc).field_1 + 8) = uVar3;
    pEVar15->type_ = Return;
    puVar16 = &ExprMixin<(wabt::ExprType)31>::vtable;
    goto LAB_00f73d45;
  case ReturnCall:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    Token::~Token((Token *)auStack_98);
    loc_14.filename.size_ = sVar1;
    loc_14.filename.data_ = (char *)token.field_2._32_8_;
    loc_14.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)uVar2;
    loc_14.field_1._8_8_ = uVar3;
    RVar12 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)32>>(this,loc_14,out_expr);
    break;
  case ReturnCallIndirect:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    Token::~Token((Token *)auStack_98);
    MakeUnique<wabt::ReturnCallIndirectExpr,wabt::Location&>
              ((wabt *)auStack_98,(Location *)((long)&token.field_2.literal_.text.field_2 + 8));
    RVar12 = ParseTypeUseOpt(this,(FuncDeclaration *)((long)auStack_98 + 0x40));
    if (RVar12.enum_ == Error) goto LAB_00f73b74;
    RVar12 = ParseUnboundFuncSignature
                       (this,(FuncSignature *)
                             &(((Expr *)((long)auStack_98 + 0x80))->
                              super_intrusive_list_base<wabt::Expr>).prev_);
LAB_00f73b6b:
    auVar18 = auStack_98;
    if (RVar12.enum_ == Error) {
LAB_00f73b74:
      if (auStack_98 != (undefined1  [8])0x0) {
        (*(*(_func_int ***)auStack_98)[1])();
      }
      return (Result)Error;
    }
    auStack_98 = (undefined1  [8])0x0;
    pEVar15 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
              _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
              super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)auVar18;
    auVar18 = auStack_98;
    if (pEVar15 != (Expr *)0x0) {
      (*pEVar15->_vptr_Expr[1])();
      auVar18 = auStack_98;
    }
    goto LAB_00f73d52;
  case Select:
    Consume(&local_8d8,this);
    Token::~Token(&local_8d8);
    pEVar15 = (Expr *)operator_new(0x40);
    (pEVar15->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar15->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar15->_vptr_Expr = (_func_int **)&PTR__Expr_0155b510;
    (pEVar15->loc).filename.data_ = (char *)token.field_2._32_8_;
    (pEVar15->loc).filename.size_ = sVar1;
    *(undefined8 *)&(pEVar15->loc).field_1 = uVar2;
    *(undefined8 *)((long)&(pEVar15->loc).field_1 + 8) = uVar3;
    pEVar15->type_ = Select;
    puVar16 = &ExprMixin<(wabt::ExprType)34>::vtable;
    goto LAB_00f73d45;
  case SetGlobal:
    Consume(&local_568,this);
    Token::~Token(&local_568);
    loc_05.filename.size_ = sVar1;
    loc_05.filename.data_ = (char *)token.field_2._32_8_;
    loc_05.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)uVar2;
    loc_05.field_1._8_8_ = uVar3;
    RVar12 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)35>>(this,loc_05,out_expr);
    break;
  case SetLocal:
    Consume(&local_658,this);
    Token::~Token(&local_658);
    loc_04.filename.size_ = sVar1;
    loc_04.filename.data_ = (char *)token.field_2._32_8_;
    loc_04.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)uVar2;
    loc_04.field_1._8_8_ = uVar3;
    RVar12 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)36>>(this,loc_04,out_expr);
    break;
  case SimdLaneOp:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    RVar12 = ParseNat(this,(uint64_t *)&stack0xfffffffffffffe28);
    if (RVar12.enum_ == Error) {
LAB_00f73135:
      Token::~Token((Token *)auStack_98);
      return (Result)Error;
    }
    pEVar15 = (Expr *)operator_new(0x48);
    if (0x33 < token.loc.field_1.field_0.last_column - 0x29U) goto LAB_00f73f0e;
    (pEVar15->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar15->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar15->_vptr_Expr = (_func_int **)&PTR__Expr_0155b510;
    *(undefined4 *)&(pEVar15->loc).filename.data_ = token.field_2._32_4_;
    *(undefined4 *)((long)&(pEVar15->loc).filename.data_ + 4) = token.field_2._36_4_;
    *(undefined4 *)&(pEVar15->loc).filename.size_ = uVar4;
    *(undefined4 *)((long)&(pEVar15->loc).filename.size_ + 4) = uVar5;
    (pEVar15->loc).field_1.field_0.line = iVar6;
    (pEVar15->loc).field_1.field_0.first_column = iVar7;
    (pEVar15->loc).field_1.field_0.last_column = uVar8;
    *(undefined4 *)((long)&(pEVar15->loc).field_1 + 0xc) = uVar9;
    pEVar15->type_ = SimdLaneOp;
    pEVar15->_vptr_Expr = (_func_int **)&PTR__Expr_0155c288;
    *(TokenType *)&pEVar15->field_0x3c = token.token_type_;
    pEVar15[1]._vptr_Expr = pp_Stack_1d8;
    goto LAB_00f73edd;
  case SimdShuffleOp:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    uStack_468 = 0;
    uStack_464 = 0;
    local_478 = 0;
    uStack_470 = 0;
    uStack_46c = 0;
    Const::Const((Const *)&stack0xfffffffffffffe28,0);
    RVar12 = ParseSimdConst(this,(Const *)&stack0xfffffffffffffe28,I32,0x10);
    if (RVar12.enum_ == Error) goto LAB_00f73135;
    pEVar15 = (Expr *)operator_new(0x50);
    if (0x33 < token.loc.field_1.field_0.last_column - 0x29U) goto LAB_00f73f0e;
    (pEVar15->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar15->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar15->_vptr_Expr = (_func_int **)&PTR__Expr_0155b510;
    *(undefined4 *)&(pEVar15->loc).filename.data_ = token.field_2._32_4_;
    *(undefined4 *)((long)&(pEVar15->loc).filename.data_ + 4) = token.field_2._36_4_;
    *(undefined4 *)&(pEVar15->loc).filename.size_ = uVar4;
    *(undefined4 *)((long)&(pEVar15->loc).filename.size_ + 4) = uVar5;
    *(undefined8 *)&(pEVar15->loc).field_1 = uVar2;
    *(undefined8 *)((long)&(pEVar15->loc).field_1 + 8) = uVar3;
    pEVar15->type_ = SimdShuffleOp;
    pEVar15->_vptr_Expr = (_func_int **)&PTR__Expr_0155c2d8;
    *(TokenType *)&pEVar15->field_0x3c = token.token_type_;
    *(undefined4 *)&pEVar15[1]._vptr_Expr = local_1b0;
    *(undefined4 *)((long)&pEVar15[1]._vptr_Expr + 4) = uStack_1ac;
    *(undefined4 *)&pEVar15[1].super_intrusive_list_base<wabt::Expr>.next_ = uStack_1a8;
    *(undefined4 *)((long)&pEVar15[1].super_intrusive_list_base<wabt::Expr>.next_ + 4) = uStack_1a4;
LAB_00f73edd:
    pEVar14 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
              _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
              super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = pEVar15;
    if (pEVar14 != (Expr *)0x0) {
      (*pEVar14->_vptr_Expr[1])();
    }
    Token::~Token((Token *)auStack_98);
    goto joined_r0x00f73f03;
  case Store:
    local_178 = token.field_2._32_8_;
    sStack_170 = sVar1;
    local_168 = uVar2;
    uStack_160 = uVar3;
    Consume(&local_408,this);
    loc_02.filename.size_ = sStack_170;
    loc_02.filename.data_ = (char *)local_178;
    loc_02.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_168;
    loc_02.field_1._8_8_ = uStack_160;
    RVar12 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)39>>
                       (this,loc_02,&local_408,out_expr);
    pTVar17 = &local_408;
    goto LAB_00f73a3d;
  case TeeLocal:
    Consume(&local_608,this);
    Token::~Token(&local_608);
    loc_01.filename.size_ = sVar1;
    loc_01.filename.data_ = (char *)token.field_2._32_8_;
    loc_01.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)uVar2;
    loc_01.field_1._8_8_ = uVar3;
    RVar12 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)43>>(this,loc_01,out_expr);
    break;
  case Ternary:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    pEVar15 = (Expr *)operator_new(0x40);
    if (0x33 < token.loc.field_1.field_0.last_column - 0x29U) goto LAB_00f73f0e;
    (pEVar15->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar15->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar15->_vptr_Expr = (_func_int **)&PTR__Expr_0155b510;
    *(undefined4 *)&(pEVar15->loc).filename.data_ = token.field_2._32_4_;
    *(undefined4 *)((long)&(pEVar15->loc).filename.data_ + 4) = token.field_2._36_4_;
    *(undefined4 *)&(pEVar15->loc).filename.size_ = uVar4;
    *(undefined4 *)((long)&(pEVar15->loc).filename.size_ + 4) = uVar5;
    (pEVar15->loc).field_1.field_0.line = iVar6;
    (pEVar15->loc).field_1.field_0.first_column = iVar7;
    (pEVar15->loc).field_1.field_0.last_column = uVar8;
    *(undefined4 *)((long)&(pEVar15->loc).field_1 + 0xc) = uVar9;
    pEVar15->type_ = Ternary;
    puVar16 = &OpcodeExpr<(wabt::ExprType)44>::vtable;
    goto LAB_00f73dcb;
  case Throw:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    Token::~Token((Token *)auStack_98);
    loc_21.filename.size_ = sVar1;
    loc_21.filename.data_ = (char *)token.field_2._32_8_;
    loc_21.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)uVar2;
    loc_21.field_1._8_8_ = uVar3;
    RVar12 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)45>>(this,loc_21,out_expr);
    break;
  case Unary:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    pEVar15 = (Expr *)operator_new(0x40);
    if (0x33 < token.loc.field_1.field_0.last_column - 0x29U) goto LAB_00f73f0e;
    (pEVar15->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar15->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar15->_vptr_Expr = (_func_int **)&PTR__Expr_0155b510;
    *(undefined4 *)&(pEVar15->loc).filename.data_ = token.field_2._32_4_;
    *(undefined4 *)((long)&(pEVar15->loc).filename.data_ + 4) = token.field_2._36_4_;
    *(undefined4 *)&(pEVar15->loc).filename.size_ = uVar4;
    *(undefined4 *)((long)&(pEVar15->loc).filename.size_ + 4) = uVar5;
    (pEVar15->loc).field_1.field_0.line = iVar6;
    (pEVar15->loc).field_1.field_0.first_column = iVar7;
    (pEVar15->loc).field_1.field_0.last_column = uVar8;
    *(undefined4 *)((long)&(pEVar15->loc).field_1 + 0xc) = uVar9;
    pEVar15->type_ = Unary;
    puVar16 = &OpcodeExpr<(wabt::ExprType)47>::vtable;
LAB_00f73dcb:
    pEVar15->_vptr_Expr = (_func_int **)(puVar16 + 0x10);
    *(TokenType *)&pEVar15->field_0x3c = token.token_type_;
    pEVar14 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
              _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
              super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = pEVar15;
LAB_00f73ddb:
    if (pEVar14 != (Expr *)0x0) {
      (*pEVar14->_vptr_Expr[1])();
    }
    Token::~Token((Token *)auStack_98);
    goto LAB_00f73e3e;
  case Last_Opcode:
    Consume(&local_9c8,this);
    Token::~Token(&local_9c8);
    pEVar15 = (Expr *)operator_new(0x40);
    (pEVar15->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar15->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar15->_vptr_Expr = (_func_int **)&PTR__Expr_0155b510;
    (pEVar15->loc).filename.data_ = (char *)token.field_2._32_8_;
    (pEVar15->loc).filename.size_ = sVar1;
    *(undefined8 *)&(pEVar15->loc).field_1 = uVar2;
    *(undefined8 *)((long)&(pEVar15->loc).field_1 + 8) = uVar3;
    pEVar15->type_ = Last;
    puVar16 = &ExprMixin<(wabt::ExprType)48>::vtable;
LAB_00f73d45:
    pEVar15->_vptr_Expr = (_func_int **)(puVar16 + 0x10);
    auVar18 = (undefined1  [8])
              (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
              _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
              super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = pEVar15;
LAB_00f73d52:
    if (auVar18 != (undefined1  [8])0x0) {
      (*((Expr *)auVar18)->_vptr_Expr[1])();
    }
    goto LAB_00f73e3e;
  }
  EVar13 = Error;
  if (RVar12.enum_ != Error) {
LAB_00f73e3e:
    EVar13 = Ok;
  }
  return (Result)EVar13;
}

Assistant:

Result WastParser::ParsePlainInstr(std::unique_ptr<Expr>* out_expr) {
  WABT_TRACE(ParsePlainInstr);
  Location loc = GetLocation();
  switch (Peek()) {
    case TokenType::Unreachable:
      Consume();
      out_expr->reset(new UnreachableExpr(loc));
      break;

    case TokenType::Nop:
      Consume();
      out_expr->reset(new NopExpr(loc));
      break;

    case TokenType::Drop:
      Consume();
      out_expr->reset(new DropExpr(loc));
      break;

    case TokenType::Select:
      Consume();
      out_expr->reset(new SelectExpr(loc));
      break;

    case TokenType::Br:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<BrExpr>(loc, out_expr));
      break;

    case TokenType::BrIf:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<BrIfExpr>(loc, out_expr));
      break;

    case TokenType::BrTable: {
      Consume();
      auto expr = MakeUnique<BrTableExpr>(loc);
      CHECK_RESULT(ParseVarList(&expr->targets));
      expr->default_target = expr->targets.back();
      expr->targets.pop_back();
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Return:
      Consume();
      out_expr->reset(new ReturnExpr(loc));
      break;

    case TokenType::Call:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<CallExpr>(loc, out_expr));
      break;

    case TokenType::CallIndirect: {
      Consume();
      auto expr = MakeUnique<CallIndirectExpr>(loc);
      CHECK_RESULT(ParseTypeUseOpt(&expr->decl));
      CHECK_RESULT(ParseUnboundFuncSignature(&expr->decl.sig));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::ReturnCall:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<ReturnCallExpr>(loc, out_expr));
      break;

    case TokenType::ReturnCallIndirect: {
      ErrorUnlessOpcodeEnabled(Consume());
      auto expr = MakeUnique<ReturnCallIndirectExpr>(loc);
      CHECK_RESULT(ParseTypeUseOpt(&expr->decl));
      CHECK_RESULT(ParseUnboundFuncSignature(&expr->decl.sig));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::GetLocal:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<GetLocalExpr>(loc, out_expr));
      break;

    case TokenType::SetLocal:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<SetLocalExpr>(loc, out_expr));
      break;

    case TokenType::TeeLocal:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<TeeLocalExpr>(loc, out_expr));
      break;

    case TokenType::GetGlobal:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<GetGlobalExpr>(loc, out_expr));
      break;

    case TokenType::SetGlobal:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<SetGlobalExpr>(loc, out_expr));
      break;

    case TokenType::Load:
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<LoadExpr>(loc, Consume(), out_expr));
      break;

    case TokenType::Store:
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<StoreExpr>(loc, Consume(), out_expr));
      break;

    case TokenType::Const: {
      Const const_;
      CHECK_RESULT(ParseConst(&const_));
      out_expr->reset(new ConstExpr(const_, loc));
      break;
    }

    case TokenType::Unary: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new UnaryExpr(token.opcode(), loc));
      break;
    }

    case TokenType::Binary:
      out_expr->reset(new BinaryExpr(Consume().opcode(), loc));
      break;

    case TokenType::Compare:
      out_expr->reset(new CompareExpr(Consume().opcode(), loc));
      break;

    case TokenType::Convert: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new ConvertExpr(token.opcode(), loc));
      break;
    }

    case TokenType::MemoryCopy:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new MemoryCopyExpr(loc));
      break;

    case TokenType::MemoryFill:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new MemoryFillExpr(loc));
      break;

    case TokenType::MemoryDrop:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<MemoryDropExpr>(loc, out_expr));
      break;

    case TokenType::MemoryInit:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<MemoryInitExpr>(loc, out_expr));
      break;

    case TokenType::MemorySize:
      Consume();
      out_expr->reset(new MemorySizeExpr(loc));
      break;

    case TokenType::MemoryGrow:
      Consume();
      out_expr->reset(new MemoryGrowExpr(loc));
      break;

    case TokenType::TableCopy:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new TableCopyExpr(loc));
      break;

    case TokenType::TableDrop:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<TableDropExpr>(loc, out_expr));
      break;

    case TokenType::TableInit:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<TableInitExpr>(loc, out_expr));
      break;

    case TokenType::Throw:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<ThrowExpr>(loc, out_expr));
      break;

    case TokenType::Rethrow:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new RethrowExpr(loc));
      break;

    case TokenType::AtomicWake: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicWakeExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicWait: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicWaitExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicLoad: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicLoadExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicStore: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicStoreExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicRmw: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicRmwExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicRmwCmpxchg: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicRmwCmpxchgExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::Ternary: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new TernaryExpr(token.opcode(), loc));
      break;
    }

    case TokenType::SimdLaneOp: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      uint64_t lane_idx;
      CHECK_RESULT(ParseNat(&lane_idx));
      out_expr->reset(new SimdLaneOpExpr(token.opcode(), lane_idx, loc));
      break;
    }

    case TokenType::SimdShuffleOp: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      Const const_;
      CHECK_RESULT((ParseSimdConst(&const_, Type::I32, sizeof(v128))));
      out_expr->reset(
          new SimdShuffleOpExpr(token.opcode(), const_.v128_bits, loc));
      break;
    }

    default:
      assert(
          !"ParsePlainInstr should only be called when IsPlainInstr() is true");
      return Result::Error;
  }

  return Result::Ok;
}